

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
* __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
::equal_range<int>(pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
                   *__return_storage_ptr__,
                  btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  *this,int *key)

{
  bool bVar1;
  template_ElementType<3UL> *ptVar2;
  long lVar3;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  bVar4;
  iterator iVar5;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_68;
  iterator local_58;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
  lower_and_equal;
  
  lower_bound_equal<int>(&lower_and_equal,this,key);
  bVar4.position_ = lower_and_equal.first.position_;
  bVar4.node_ = lower_and_equal.first.node_;
  if (lower_and_equal.second == false) {
    (__return_storage_ptr__->first).node_ = lower_and_equal.first.node_;
    (__return_storage_ptr__->first).position_ = lower_and_equal.first.position_;
    *(undefined4 *)&(__return_storage_ptr__->first).field_0xc = lower_and_equal.first._12_4_;
    (__return_storage_ptr__->second).node_ = lower_and_equal.first.node_;
    (__return_storage_ptr__->second).position_ = lower_and_equal.first.position_;
    *(undefined4 *)&(__return_storage_ptr__->second).field_0xc = lower_and_equal.first._12_4_;
  }
  else {
    bVar4._12_4_ = 0;
    bVar4 = std::
            next<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int_const&,int_const*>>
                      (bVar4,1);
    local_68.node_ = bVar4.node_;
    local_68.position_ = bVar4.position_;
    iVar5 = end(this);
    local_58.node_ = iVar5.node_;
    local_58.position_ = iVar5.position_;
    bVar1 = btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
            ::operator==(&local_68,&local_58);
    if (!bVar1) {
      lVar3 = (long)local_68.position_;
      ptVar2 = btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               ::GetField<3ul>((btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                *)local_68.node_);
      if (ptVar2[lVar3] <= *key) {
        __assert_fail("next == end() || compare_keys(key, next.key())",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x8ce,
                      "std::pair<iterator, iterator> absl::container_internal::btree<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::equal_range(const K &) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>, K = int]"
                     );
      }
    }
    (__return_storage_ptr__->first).node_ = lower_and_equal.first.node_;
    (__return_storage_ptr__->first).position_ = lower_and_equal.first.position_;
    *(undefined4 *)&(__return_storage_ptr__->first).field_0xc = lower_and_equal.first._12_4_;
    (__return_storage_ptr__->second).node_ = local_68.node_;
    *(ulong *)&(__return_storage_ptr__->second).position_ =
         CONCAT44(local_68._12_4_,local_68.position_);
  }
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::equal_range(const K &key) -> std::pair<iterator, iterator> {
  const std::pair<iterator, bool> lower_and_equal = lower_bound_equal(key);
  const iterator lower = lower_and_equal.first;
  if (!lower_and_equal.second) {
    return {lower, lower};
  }

  const iterator next = std::next(lower);
  if (!params_type::template can_have_multiple_equivalent_keys<K>()) {
    // The next iterator after lower must point to a key greater than `key`.
    // Note: if this assert fails, then it may indicate that the comparator does
    // not meet the equivalence requirements for Compare
    // (see https://en.cppreference.com/w/cpp/named_req/Compare).
    assert(next == end() || compare_keys(key, next.key()));
    return {lower, next};
  }
  // Try once more to avoid the call to upper_bound() if there's only one
  // equivalent key. This should prevent all calls to upper_bound() in cases of
  // unique-containers with heterogeneous comparators in which all comparison
  // operators have the same equivalence classes.
  if (next == end() || compare_keys(key, next.key())) return {lower, next};

  // In this case, we need to call upper_bound() to avoid worst case O(N)
  // behavior if we were to iterate over equal keys.
  return {lower, upper_bound(key)};
}